

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

Expected<std::vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>_>
* __thiscall
llvm::DWARFDebugNames::NameIndex::extractAttributeEncodings
          (Expected<std::vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>_>
           *__return_storage_ptr__,NameIndex *this,uint64_t *Offset)

{
  bool bVar1;
  reference ptVar2;
  Expected<llvm::DWARFDebugNames::AttributeEncoding> local_60;
  undefined1 local_48 [8];
  Expected<llvm::DWARFDebugNames::AttributeEncoding> AttrEncOr;
  vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  Result;
  uint64_t *Offset_local;
  NameIndex *this_local;
  
  std::
  vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ::vector((vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
            *)&AttrEncOr.field_0x8);
  do {
    extractAttributeEncoding((NameIndex *)local_48,(uint64_t *)this);
    bVar1 = llvm::Expected::operator_cast_to_bool((Expected *)local_48);
    if (bVar1) {
      ptVar2 = Expected<llvm::DWARFDebugNames::AttributeEncoding>::operator*
                         ((Expected<llvm::DWARFDebugNames::AttributeEncoding> *)local_48);
      bVar1 = isSentinel(ptVar2);
      if (bVar1) {
        Expected<std::vector<llvm::DWARFDebugNames::AttributeEncoding,std::allocator<llvm::DWARFDebugNames::AttributeEncoding>>>
        ::
        Expected<std::vector<llvm::DWARFDebugNames::AttributeEncoding,std::allocator<llvm::DWARFDebugNames::AttributeEncoding>>>
                  ((Expected<std::vector<llvm::DWARFDebugNames::AttributeEncoding,std::allocator<llvm::DWARFDebugNames::AttributeEncoding>>>
                    *)__return_storage_ptr__,
                   (vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                    *)&AttrEncOr.field_0x8,(type *)0x0);
        bVar1 = true;
      }
      else {
        ptVar2 = Expected<llvm::DWARFDebugNames::AttributeEncoding>::operator*
                           ((Expected<llvm::DWARFDebugNames::AttributeEncoding> *)local_48);
        std::
        vector<llvm::DWARFDebugNames::AttributeEncoding,std::allocator<llvm::DWARFDebugNames::AttributeEncoding>>
        ::emplace_back<llvm::DWARFDebugNames::AttributeEncoding&>
                  ((vector<llvm::DWARFDebugNames::AttributeEncoding,std::allocator<llvm::DWARFDebugNames::AttributeEncoding>>
                    *)&AttrEncOr.field_0x8,ptVar2);
        bVar1 = false;
      }
    }
    else {
      Expected<llvm::DWARFDebugNames::AttributeEncoding>::takeError(&local_60);
      Expected<std::vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>_>
      ::Expected(__return_storage_ptr__,(Error *)&local_60);
      Error::~Error((Error *)&local_60);
      bVar1 = true;
    }
    Expected<llvm::DWARFDebugNames::AttributeEncoding>::~Expected
              ((Expected<llvm::DWARFDebugNames::AttributeEncoding> *)local_48);
  } while (!bVar1);
  std::
  vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ::~vector((vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
             *)&AttrEncOr.field_0x8);
  return __return_storage_ptr__;
}

Assistant:

Expected<std::vector<DWARFDebugNames::AttributeEncoding>>
DWARFDebugNames::NameIndex::extractAttributeEncodings(uint64_t *Offset) {
  std::vector<AttributeEncoding> Result;
  for (;;) {
    auto AttrEncOr = extractAttributeEncoding(Offset);
    if (!AttrEncOr)
      return AttrEncOr.takeError();
    if (isSentinel(*AttrEncOr))
      return std::move(Result);

    Result.emplace_back(*AttrEncOr);
  }
}